

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O1

void train(void)

{
  vw *vw_obj;
  ostream *poVar1;
  size_t pass;
  long lVar2;
  string init_str;
  Generator gen;
  Trie dict;
  char *local_128;
  long local_120;
  char local_118 [16];
  string local_108;
  string local_e8;
  Generator local_c8;
  Trie local_80;
  
  load_dictionary(&local_80,"phrase-table.vocab");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  Trie::build_max(&local_80,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"
             ,"");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_128,local_128 + local_120);
  vw_obj = VW::initialize(&local_108,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_128,local_120);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  Generator::Generator(&local_c8,vw_obj,(Trie *)0x0);
  lVar2 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"===== pass ",0xb);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," =====",6);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    run_istream(&local_c8,"phrase-table.tr",true,0);
    run_istream(&local_c8,"phrase-table.tr",false,300000);
    run_istream(&local_c8,"phrase-table.te",false,100000);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x15);
  VW::finish(vw_obj,true);
  SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~SearchTask(&local_c8.
                 super_SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  Trie::~Trie(&local_80);
  return;
}

Assistant:

void train()
{ // initialize VW as usual, but use 'hook' as the search_task
  Trie dict = load_dictionary("phrase-table.vocab");
  dict.build_max();
  //dict.print();

  string init_str("--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"); //  --search_use_passthrough_repr"); // -q si -q wi -q ci -q di  -f my_model
  vw& vw_obj = *VW::initialize(init_str);
  cerr << init_str << endl;
  Generator gen(vw_obj, nullptr); // &dict);
  for (size_t pass=1; pass<=20; pass++)
  { cerr << "===== pass " << pass << " =====" << endl;
    run_istream(gen, "phrase-table.tr", true);
    run_istream(gen, "phrase-table.tr", false, 300000);
    run_istream(gen, "phrase-table.te", false, 100000);
  }
  VW::finish(vw_obj);
}